

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::IfcFooting(IfcFooting *this)

{
  IfcFooting *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcFooting");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00f87090);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>,
             &PTR_construction_vtable_24__00f871c8);
  *(undefined8 *)this = 0xf86f60;
  *(undefined8 *)&this->field_0x178 = 0xf87078;
  *(undefined8 *)&this->field_0x88 = 0xf86f88;
  *(undefined8 *)&this->field_0x98 = 0xf86fb0;
  *(undefined8 *)&this->field_0xd0 = 0xf86fd8;
  *(undefined8 *)&this->field_0x100 = 0xf87000;
  *(undefined8 *)&this->field_0x138 = 0xf87028;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf87050;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x10);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}